

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O2

void VP8LCreateHuffmanTree
               (uint32_t *histogram,int tree_depth_limit,uint8_t *buf_rle,HuffmanTree *huff_tree,
               HuffmanTreeCode *huff_code)

{
  uint32_t *puVar1;
  HuffmanTree *pHVar2;
  byte bVar3;
  byte *bit_depths;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  HuffmanTree *pool;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  uint32_t uVar12;
  int iVar13;
  HuffmanTree *pHVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint32_t retval;
  uint uVar23;
  uint8_t *puVar24;
  int i;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint32_t next_code [16];
  
  uVar23 = huff_code->num_symbols;
  uVar16 = (ulong)uVar23;
  memset(buf_rle,0,(long)(int)uVar23);
  uVar25 = uVar16;
  uVar19 = 0xffffffff;
  if ((int)uVar23 < -1) {
    uVar19 = uVar23;
  }
  do {
    uVar7 = uVar25;
    uVar17 = (uint)uVar7;
    if ((int)uVar17 < 0) {
      uVar7 = (ulong)uVar19;
      uVar17 = uVar19;
      break;
    }
    if (uVar17 == 0) goto LAB_001348b4;
    uVar25 = (ulong)(uVar17 - 1);
  } while (histogram[uVar7 - 1] == 0);
  uVar12 = *histogram;
  lVar22 = (long)(int)uVar17;
  lVar15 = -1;
  if (-1 < lVar22) {
    lVar15 = lVar22;
  }
  puVar24 = buf_rle + -1;
  uVar19 = 0;
  for (uVar25 = 0; uVar25 != lVar15 + 1U; uVar25 = uVar25 + 1) {
    if ((uVar25 == uVar7) || (histogram[uVar25] != uVar12)) {
      if ((uVar12 == 0 && 4 < (int)uVar19) || (6 < (int)uVar19 && uVar12 != 0)) {
        for (lVar27 = 0; -lVar27 != (ulong)uVar19; lVar27 = lVar27 + -1) {
          puVar24[lVar27] = '\x01';
        }
      }
      uVar19 = 1;
      if (uVar25 != uVar7) {
        uVar12 = histogram[uVar25];
      }
    }
    else {
      uVar19 = uVar19 + 1;
    }
    puVar24 = puVar24 + 1;
  }
  uVar19 = *histogram;
  uVar25 = 0;
  uVar21 = 1;
  uVar20 = 0;
  uVar12 = 0;
  do {
    if (uVar25 == lVar15 + 1U) {
LAB_001348b4:
      bit_depths = huff_code->code_lengths;
      uVar25 = 0;
      if ((int)uVar23 < 1) {
        uVar16 = uVar25;
      }
      uVar19 = 0;
      for (; uVar16 != uVar25; uVar25 = uVar25 + 1) {
        uVar19 = (uVar19 + 1) - (uint)(histogram[uVar25] == 0);
      }
      if (uVar19 != 0) {
        uVar25 = (ulong)uVar19;
        pool = huff_tree + uVar25;
        uVar17 = 1;
        do {
          iVar13 = 0;
          for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
            uVar21 = histogram[uVar7];
            if (uVar21 != 0) {
              if (uVar21 <= uVar17) {
                uVar21 = uVar17;
              }
              huff_tree[iVar13].total_count_ = uVar21;
              huff_tree[iVar13].value_ = (int)uVar7;
              huff_tree[iVar13].pool_index_left_ = -1;
              huff_tree[iVar13].pool_index_right_ = -1;
              iVar13 = iVar13 + 1;
            }
          }
          qsort(huff_tree,uVar25,0x10,CompareHuffmanTrees);
          if (uVar19 == 1) {
            bit_depths[huff_tree->value_] = 1;
          }
          else {
            uVar28 = 0;
            uVar29 = uVar25 - 2;
            for (uVar7 = uVar25; 1 < (long)uVar7; uVar7 = uVar7 - 1) {
              uVar26 = uVar28 | 1;
              pHVar14 = huff_tree + (uVar7 - 1);
              iVar13 = pHVar14->value_;
              iVar5 = pHVar14->pool_index_left_;
              iVar6 = pHVar14->pool_index_right_;
              pHVar2 = pool + uVar28;
              pHVar2->total_count_ = pHVar14->total_count_;
              pHVar2->value_ = iVar13;
              pHVar2->pool_index_left_ = iVar5;
              pHVar2->pool_index_right_ = iVar6;
              local_c0 = uVar28 + 2;
              pHVar14 = huff_tree + (uVar7 - 2);
              iVar13 = pHVar14->value_;
              iVar5 = pHVar14->pool_index_left_;
              iVar6 = pHVar14->pool_index_right_;
              pHVar2 = pool + uVar26;
              pHVar2->total_count_ = pHVar14->total_count_;
              pHVar2->value_ = iVar13;
              pHVar2->pool_index_left_ = iVar5;
              pHVar2->pool_index_right_ = iVar6;
              uVar21 = pool[uVar28].total_count_ + pool[uVar26].total_count_;
              uVar8 = 0;
              for (pHVar14 = huff_tree;
                  (uVar9 = uVar29, uVar29 != uVar8 &&
                  (uVar9 = uVar8, uVar21 < pHVar14->total_count_)); pHVar14 = pHVar14 + 1) {
                uVar8 = uVar8 + 1;
              }
              pHVar14 = huff_tree + (uVar9 & 0xffffffff);
              memmove(pHVar14 + 1,huff_tree + (uVar9 & 0xffffffff),
                      ((uVar7 - 2) - (long)(int)uVar9) * 0x10);
              pHVar14->total_count_ = uVar21;
              pHVar14->value_ = -1;
              pHVar14->pool_index_left_ = (int)uVar26;
              pHVar14->pool_index_right_ = (int)uVar28;
              uVar29 = uVar29 - 1;
              uVar28 = local_c0;
            }
            SetBitDepths(huff_tree,pool,bit_depths,0);
          }
          uVar21 = (uint)*bit_depths;
          for (lVar15 = 1; lVar15 < (int)uVar23; lVar15 = lVar15 + 1) {
            if (uVar21 <= bit_depths[lVar15]) {
              uVar21 = (uint)bit_depths[lVar15];
            }
          }
          uVar17 = uVar17 * 2;
        } while (tree_depth_limit < (int)uVar21);
      }
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      local_b8 = (undefined1  [16])0x0;
      uVar16 = 0;
      uVar25 = (ulong)(uint)huff_code->num_symbols;
      if (huff_code->num_symbols < 1) {
        uVar25 = uVar16;
      }
      for (; uVar25 != uVar16; uVar16 = uVar16 + 1) {
        *(int *)(local_b8 + (ulong)huff_code->code_lengths[uVar16] * 4) =
             *(int *)(local_b8 + (ulong)huff_code->code_lengths[uVar16] * 4) + 1;
      }
      auVar4._12_4_ = 0;
      auVar4._0_12_ = local_b8._4_12_;
      local_b8 = auVar4 << 0x20;
      next_code[0] = 0;
      uVar12 = 0;
      for (lVar15 = 1; lVar15 != 0x10; lVar15 = lVar15 + 1) {
        uVar12 = (uVar12 + *(int *)(local_b8 + lVar15 * 4 + -4)) * 2;
        next_code[lVar15] = uVar12;
      }
      for (uVar16 = 0; uVar16 != uVar25; uVar16 = uVar16 + 1) {
        bVar3 = huff_code->code_lengths[uVar16];
        uVar12 = next_code[bVar3];
        next_code[bVar3] = uVar12 + 1;
        uVar23 = 0;
        bVar10 = 0xc;
        for (uVar19 = 0; uVar19 < bVar3; uVar19 = uVar19 + 4) {
          uVar23 = uVar23 | (uint)""[uVar12 & 0xf] << (bVar10 & 0x1f);
          uVar12 = uVar12 >> 4;
          bVar10 = bVar10 - 4;
        }
        huff_code->codes[uVar16] = (uint16_t)(uVar23 >> (0x10 - bVar3 & 0x1f));
      }
      return;
    }
    if (((uVar25 == uVar7) || (buf_rle[uVar25] != '\0')) ||
       ((uVar25 != 0 && (buf_rle[uVar25 - 1] != '\0')))) {
LAB_001347d0:
      if ((3 < uVar20) || ((uVar20 == 3 && (uVar12 == 0)))) {
        uVar11 = (uVar20 >> 1) + uVar12;
        uVar19 = uVar11 / uVar20;
        if (uVar11 < uVar20) {
          uVar19 = uVar21;
        }
        if (uVar12 == 0) {
          uVar19 = 0;
        }
        for (lVar27 = -1; (ulong)uVar20 + lVar27 != -1; lVar27 = lVar27 + -1) {
          histogram[(uint)((int)uVar25 + (int)lVar27)] = uVar19;
        }
      }
      if ((long)uVar25 < (long)(int)(uVar17 - 3)) {
        puVar1 = histogram + uVar25;
        uVar19 = puVar1[3] + puVar1[1] + puVar1[2] + *puVar1 + 2 >> 2;
      }
      else {
        uVar19 = 0;
        if ((long)uVar25 < lVar22) {
          uVar19 = histogram[uVar25];
        }
      }
      uVar12 = 0;
      uVar20 = uVar21;
      if (uVar25 != uVar7) {
        uVar12 = histogram[uVar25];
      }
    }
    else {
      uVar18 = histogram[uVar25] - uVar19;
      uVar11 = -uVar18;
      if (0 < (int)uVar18) {
        uVar11 = uVar18;
      }
      if (3 < uVar11) goto LAB_001347d0;
      uVar20 = uVar20 + 1;
      uVar12 = histogram[uVar25] + uVar12;
      if (3 < uVar20) {
        uVar19 = ((uVar20 >> 1) + uVar12) / uVar20;
      }
    }
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

void VP8LCreateHuffmanTree(uint32_t* const histogram, int tree_depth_limit,
                           uint8_t* const buf_rle, HuffmanTree* const huff_tree,
                           HuffmanTreeCode* const huff_code) {
  const int num_symbols = huff_code->num_symbols;
  memset(buf_rle, 0, num_symbols * sizeof(*buf_rle));
  OptimizeHuffmanForRle(num_symbols, buf_rle, histogram);
  GenerateOptimalTree(histogram, num_symbols, huff_tree, tree_depth_limit,
                      huff_code->code_lengths);
  // Create the actual bit codes for the bit lengths.
  ConvertBitDepthsToSymbols(huff_code);
}